

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

int Abc_AigCleanup(Abc_Aig_t *pMan)

{
  int iVar1;
  int iVar2;
  uint *__ptr;
  void *pvVar3;
  long lVar4;
  Abc_Obj_t *pAVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  iVar1 = pMan->nEntries;
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar3 = malloc(800);
  *(void **)(__ptr + 2) = pvVar3;
  iVar2 = pMan->nBins;
  if (iVar2 < 1) {
LAB_001b4eeb:
    if (pvVar3 == (void *)0x0) goto LAB_001b4ef8;
  }
  else {
    uVar6 = 0;
    uVar8 = 100;
    lVar9 = 0;
    do {
      pAVar5 = pMan->pBins[lVar9];
      if (pAVar5 != (Abc_Obj_t *)0x0) {
        do {
          if ((pAVar5->vFanouts).nSize == 0) {
            uVar7 = (uint)uVar8;
            if (uVar6 == uVar7) {
              if ((int)uVar7 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar3 = malloc(0x80);
                }
                else {
                  pvVar3 = realloc(*(void **)(__ptr + 2),0x80);
                }
                *(void **)(__ptr + 2) = pvVar3;
                *__ptr = 0x10;
                uVar8 = 0x10;
              }
              else {
                uVar8 = (ulong)(uVar7 * 2);
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar3 = malloc(uVar8 * 8);
                }
                else {
                  pvVar3 = realloc(*(void **)(__ptr + 2),uVar8 * 8);
                }
                *(void **)(__ptr + 2) = pvVar3;
                *__ptr = uVar7 * 2;
              }
            }
            else {
              pvVar3 = *(void **)(__ptr + 2);
            }
            lVar4 = (long)(int)uVar6;
            uVar6 = uVar6 + 1;
            __ptr[1] = uVar6;
            *(Abc_Obj_t **)((long)pvVar3 + lVar4 * 8) = pAVar5;
          }
          pAVar5 = pAVar5->pNext;
        } while (pAVar5 != (Abc_Obj_t *)0x0);
        iVar2 = pMan->nBins;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar2);
    pvVar3 = *(void **)(__ptr + 2);
    if ((int)uVar6 < 1) goto LAB_001b4eeb;
    uVar8 = 0;
    do {
      Abc_AigDeleteNode(pMan,*(Abc_Obj_t **)((long)pvVar3 + uVar8 * 8));
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  free(pvVar3);
LAB_001b4ef8:
  free(__ptr);
  return iVar1 - pMan->nEntries;
}

Assistant:

int Abc_AigCleanup( Abc_Aig_t * pMan )
{
    Vec_Ptr_t * vDangles;
    Abc_Obj_t * pAnd;
    int i, nNodesOld;
//    printf( "Strash0 = %d.  Strash1 = %d.  Strash100 = %d.  StrashM = %d.\n", 
//        pMan->nStrash0, pMan->nStrash1, pMan->nStrash5, pMan->nStrash2 );
    nNodesOld = pMan->nEntries;
    // collect the AND nodes that do not fanout
    vDangles = Vec_PtrAlloc( 100 );
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pAnd )
            if ( Abc_ObjFanoutNum(pAnd) == 0 )
                Vec_PtrPush( vDangles, pAnd );
    // process the dangling nodes and their MFFCs
    Vec_PtrForEachEntry( Abc_Obj_t *, vDangles, pAnd, i )
        Abc_AigDeleteNode( pMan, pAnd );
    Vec_PtrFree( vDangles );
    return nNodesOld - pMan->nEntries;
}